

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

bool __thiscall wallet::SQLiteBatch::TxnAbort(SQLiteBatch *this)

{
  string_view logging_function;
  int iVar1;
  pointer pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  int res;
  Level in_stack_000000d0;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  CSemaphore *in_stack_ffffffffffffff30;
  SQLiteDatabase *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  char *func;
  char *in_stack_ffffffffffffff60;
  unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
  *in_stack_ffffffffffffff68;
  allocator<char> *__a;
  allocator<char> *__s;
  LogFlags in_stack_ffffffffffffff90;
  int source_line;
  bool local_51;
  allocator<char> local_2a;
  undefined1 local_29;
  ConstevalFormatString<0U> in_stack_ffffffffffffffd8;
  string_view in_stack_ffffffffffffffe0;
  size_t in_stack_fffffffffffffff0;
  char *pcVar3;
  
  pcVar3 = *(char **)(in_FS_OFFSET + 0x28);
  if ((*(long *)(in_RDI->_M_string_length + 200) == 0) ||
     (((ulong)in_RDI[2]._M_dataplus._M_p & 1) == 0)) {
    local_51 = false;
  }
  else {
    local_29 = SQLiteDatabase::HasActiveTxn(in_stack_ffffffffffffff38);
    func = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    iVar1 = 0;
    inline_assertion_check<true,bool>
              ((bool *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
               ,(char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    inline_assertion_check<true,std::unique_ptr<wallet::SQliteExecHandler,std::default_delete<wallet::SQliteExecHandler>>&>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,iVar1,func,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    pSVar2 = std::
             unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
             ::operator->((unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
                           *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    __a = (allocator<char> *)in_RDI->_M_string_length;
    __s = &local_2a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
    iVar1 = (*pSVar2->_vptr_SQliteExecHandler[2])(pSVar2,__a,&stack0xffffffffffffffd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::allocator<char>::~allocator(&local_2a);
    if (iVar1 == 0) {
      *(undefined1 *)&in_RDI[2]._M_dataplus._M_p = 0;
      CSemaphore::post(in_stack_ffffffffffffff30);
    }
    else {
      source_line = iVar1;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(iVar1,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(iVar1,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40);
      logging_function._M_str = pcVar3;
      logging_function._M_len = in_stack_fffffffffffffff0;
      LogPrintFormatInternal<>
                (logging_function,in_stack_ffffffffffffffe0,source_line,in_stack_ffffffffffffff90,
                 in_stack_000000d0,in_stack_ffffffffffffffd8);
      iVar1 = source_line;
    }
    local_51 = iVar1 == 0;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar3) {
    return local_51;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::TxnAbort()
{
    if (!m_database.m_db || !m_txn) return false;
    Assert(m_database.HasActiveTxn());
    int res = Assert(m_exec_handler)->Exec(m_database, "ROLLBACK TRANSACTION");
    if (res != SQLITE_OK) {
        LogPrintf("SQLiteBatch: Failed to abort the transaction\n");
    } else {
        m_txn = false;
        m_database.m_write_semaphore.post();
    }
    return res == SQLITE_OK;
}